

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_71cb::StatePointer_GetStateNull_Test::TestBody
          (StatePointer_GetStateNull_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Foo **in_RCX;
  Foo foo;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)&stack0xffffffffffffffc0,
             (pointer_type)&stack0xffffffffffffffbc,0);
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_ptr
                 ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                  &stack0xffffffffffffffc0);
  local_20.data_ = (AssertHelperData *)&stack0xffffffffffffffbc;
  testing::internal::EqHelper<false>::
  Compare<(anonymous_namespace)::Foo*,(anonymous_namespace)::Foo*>
            ((char *)&p,(char *)&gtest_ar.message_,(Foo **)&local_20,in_RCX);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p);
  if (bVar1) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
  }
  else {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
    testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
    if (!bVar1) {
      return;
    }
  }
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::get_state
                 ((state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> *)
                  &stack0xffffffffffffffc0);
  local_20.data_ = (AssertHelperData *)0x0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)&p,"p.get_state()","0ul",(unsigned_long *)&gtest_ar.message_,
             (unsigned_long *)&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&p);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)&p);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x20,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&p);
  return;
}

Assistant:

TEST(StatePointer, GetStateNull) {
	Foo foo;
	state_ptr<Foo> p{&foo, 0};
	ASSERT_EQ(p.get_ptr(), &foo);
	ASSERT_EQ(p.get_state(), 0ul);
}